

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O0

pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* mp::ReadSOLFile<mp::NLW2_SOLHandler_C_Impl>
            (string *name,NLW2_SOLHandler_C_Impl *solh,NLUtils *utl,int *p_internal_rv)

{
  NLW2_SOLReadResultCode NVar1;
  string *__x;
  SOLReader2<mp::NLW2_SOLHandler_C_Impl> *in_RDI;
  int *in_R8;
  NLW2_SOLReadResultCode res;
  SOLReader2<mp::NLW2_SOLHandler_C_Impl> solr;
  undefined4 in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb24;
  string *in_stack_ffffffffffffffa0;
  SOLReader2<mp::NLW2_SOLHandler_C_Impl> *in_stack_ffffffffffffffa8;
  
  SOLReader2<mp::NLW2_SOLHandler_C_Impl>::SOLReader2
            (in_RDI,(NLW2_SOLHandler_C_Impl *)in_RDI,
             (NLUtils *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  NVar1 = SOLReader2<mp::NLW2_SOLHandler_C_Impl>::ReadSOLFile
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (in_R8 != (int *)0x0) {
    in_stack_fffffffffffffb24 =
         SOLReader2<mp::NLW2_SOLHandler_C_Impl>::internal_rv
                   ((SOLReader2<mp::NLW2_SOLHandler_C_Impl> *)&stack0xfffffffffffffb58);
    *in_R8 = in_stack_fffffffffffffb24;
  }
  __x = SOLReader2<mp::NLW2_SOLHandler_C_Impl>::ErrorMessage_abi_cxx11_
                  ((SOLReader2<mp::NLW2_SOLHandler_C_Impl> *)&stack0xfffffffffffffb58,NVar1);
  std::
  pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<NLW2_SOLReadResultCode_&,_true>
            ((pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             (NLW2_SOLReadResultCode *)__x,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x121ab7);
  SOLReader2<mp::NLW2_SOLHandler_C_Impl>::~SOLReader2
            ((SOLReader2<mp::NLW2_SOLHandler_C_Impl> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  return (pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_RDI;
}

Assistant:

inline std::pair<NLW2_SOLReadResultCode, std::string>
ReadSOLFile(
    const std::string& name,
		SOLHandler& solh, NLUtils& utl, int* p_internal_rv=nullptr) {
  SOLReader2<SOLHandler> solr(solh, utl);
	auto res = solr.ReadSOLFile(name);
	if (p_internal_rv)
		*p_internal_rv = solr.internal_rv();
	return { res, solr.ErrorMessage(res) };
}